

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

HFSubConsumer * __thiscall
AbstractModuleClient::subscribeHighFreqData
          (AbstractModuleClient *this,string *dataName,string *originModule,
          size_t messageBufferLength)

{
  bool bVar1;
  SubType SVar2;
  HFSubConsumer *this_00;
  string *in_RDX;
  string *in_RSI;
  string *in_stack_00000038;
  string *in_stack_00000040;
  MlmWrap *in_stack_00000048;
  HighFreqSub *sub;
  size_t in_stack_00000120;
  HighFreqDataType *in_stack_00000128;
  MlmWrap *in_stack_00000130;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  network_pimpl *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  network_pimpl *in_stack_ffffffffffffff08;
  string local_c0 [32];
  string local_a0 [32];
  HFSubConsumer *local_80;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  MlmWrap *in_stack_ffffffffffffffa8;
  string local_48 [64];
  HFSubConsumer *local_8;
  
  std::__cxx11::string::string(local_48,in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,in_RDX);
  bVar1 = MlmWrap::isHfTypeCurrentlySubbed
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_48);
  if (bVar1) {
    std::__cxx11::string::string(local_a0,in_RSI);
    std::__cxx11::string::string(local_c0,in_RDX);
    this_00 = (HFSubConsumer *)
              MlmWrap::getHfSubObject(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_a0);
    local_80 = this_00;
    SVar2 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
    if (SVar2 == ST_CONSUMER) {
      return local_80;
    }
  }
  bVar1 = network_pimpl::hfdt_exists
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar1) {
    network_pimpl::find_hfdt
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (string *)in_stack_fffffffffffffef8);
    local_8 = MlmWrap::createConsumerSub(in_stack_00000130,in_stack_00000128,in_stack_00000120);
    HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_8);
  }
  else {
    local_8 = (HFSubConsumer *)0x0;
  }
  return local_8;
}

Assistant:

HFSubConsumer* AbstractModuleClient::subscribeHighFreqData(std::string dataName, std::string originModule, size_t messageBufferLength) {
//    std::cout << "mlmWRAP: Attempting to make a Consumer Sub to [" << dataName << "] from [" << originModule << "]\n";

    if (isHfTypeCurrentlySubbed(dataName, originModule)) { //if the module is already subbed, return the current sub object
        HighFreqSub* sub = getHfSubObject(dataName, originModule);
        if(sub->getSubSockType() == HighFreqSub::ST_CONSUMER)
            return (HFSubConsumer*)sub;
    }

    if (state->hfdt_exists(dataName, originModule)) { //check to make sure the requested type is provided by another module
        return( createConsumerSub( state->find_hfdt(dataName, originModule), messageBufferLength ) );
    }
    else {
        // std::cerr << error("The specified type does not exist.\n");
        return(NULL);
    }
}